

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void mi_segment_try_purge(mi_segment_t *segment,_Bool force)

{
  _Bool _Var1;
  size_t sVar2;
  byte in_SIL;
  long in_RDI;
  size_t size;
  uint8_t *p;
  size_t count;
  size_t idx;
  mi_commit_mask_t mask;
  mi_msecs_t now;
  size_t local_60;
  mi_commit_mask_t local_58;
  mi_msecs_t local_18;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  if (((((*(byte *)(in_RDI + 0x19) & 1) != 0) && (*(long *)(in_RDI + 0x30) != 0)) &&
      (local_8 = in_RDI, _Var1 = mi_commit_mask_is_empty((mi_commit_mask_t *)(in_RDI + 0x38)),
      !_Var1)) &&
     ((local_18 = _mi_clock_now(), (local_9 & 1) != 0 || (*(long *)(local_8 + 0x30) <= local_18))))
  {
    memcpy(&local_58,(void *)(local_8 + 0x38),0x40);
    *(undefined8 *)(local_8 + 0x30) = 0;
    mi_commit_mask_create_empty((mi_commit_mask_t *)(local_8 + 0x38));
    local_60 = 0;
    while (sVar2 = _mi_commit_mask_next_run(&local_58,&local_60), sVar2 != 0) {
      if (sVar2 != 0) {
        mi_segment_purge((mi_segment_t *)mask.mask[3],(uint8_t *)mask.mask[2],mask.mask[1]);
      }
      local_60 = sVar2 + local_60;
    }
  }
  return;
}

Assistant:

static void mi_segment_try_purge(mi_segment_t* segment, bool force) {
  if (!segment->allow_purge || segment->purge_expire == 0 || mi_commit_mask_is_empty(&segment->purge_mask)) return;
  mi_msecs_t now = _mi_clock_now();
  if (!force && now < segment->purge_expire) return;

  mi_commit_mask_t mask = segment->purge_mask;
  segment->purge_expire = 0;
  mi_commit_mask_create_empty(&segment->purge_mask);

  size_t idx;
  size_t count;
  mi_commit_mask_foreach(&mask, idx, count) {
    // if found, decommit that sequence
    if (count > 0) {
      uint8_t* p = (uint8_t*)segment + (idx*MI_COMMIT_SIZE);
      size_t size = count * MI_COMMIT_SIZE;
      mi_segment_purge(segment, p, size);
    }
  }
  mi_commit_mask_foreach_end()
  mi_assert_internal(mi_commit_mask_is_empty(&segment->purge_mask));
}